

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool set_nearby_voice_dir_path(OpenJTalk *oj,char *path)

{
  _Bool _Var1;
  char *pcVar2;
  char **ppcVar3;
  char temp [260];
  char parent [260];
  char acStack_248 [272];
  char local_138 [272];
  
  if (path == (char *)0x0 || oj == (OpenJTalk *)0x0) {
    return false;
  }
  if (*path != '\0') {
    memset(acStack_248,0,0x104);
    if (G_DEFAULT_VOICE_DIR_NAMES[0] != (char *)0x0) {
      ppcVar3 = G_DEFAULT_VOICE_DIR_NAMES;
      pcVar2 = G_DEFAULT_VOICE_DIR_NAMES[0];
      do {
        ppcVar3 = ppcVar3 + 1;
        _Var1 = search_directory_or_file(path,pcVar2,true,acStack_248);
        if (_Var1) goto LAB_0013fd30;
        pcVar2 = *ppcVar3;
      } while (pcVar2 != (char *)0x0);
    }
    get_dir(path,local_138);
    if (G_DEFAULT_VOICE_DIR_NAMES[0] != (char *)0x0 && local_138[0] != '\0') {
      ppcVar3 = G_DEFAULT_VOICE_DIR_NAMES;
      pcVar2 = G_DEFAULT_VOICE_DIR_NAMES[0];
      do {
        ppcVar3 = ppcVar3 + 1;
        _Var1 = search_directory_or_file(local_138,pcVar2,true,acStack_248);
        if (_Var1) {
LAB_0013fd30:
          strcpy(oj->dn_voice_dir_path,acStack_248);
          return true;
        }
        pcVar2 = *ppcVar3;
      } while (pcVar2 != (char *)0x0);
    }
  }
  return false;
}

Assistant:

bool set_nearby_voice_dir_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return false;
	}

	if (path == NULL || strlen(path) == 0)
	{
		return false;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// 指定位置から可能性のあるフォルダを探す
	for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
	{
		if (search_directory(path, *d, temp))
		{
			goto return_true;
		}
	}

	// その親ディレクトリから可能性のあるフォルダを探す
	char parent[MAX_PATH];
	get_dir_path(path, parent);
	if (parent != NULL && strlen(parent) != 0)
	{
		for (const char **d = G_DEFAULT_VOICE_DIR_NAMES; *d != NULL; d++)
		{
			if (search_directory(parent, *d, temp))
			{
				goto return_true;
			}
		}
	}
	return false;

return_true:
	strcpy(oj->dn_voice_dir_path, temp);
	return true;
}